

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.c
# Opt level: O0

_Bool upb_Message_IsEqual(upb_Message *msg1,upb_Message *msg2,upb_MiniTable *m,int options)

{
  _Bool _Var1;
  upb_UnknownCompareResult uVar2;
  int options_local;
  upb_MiniTable *m_local;
  upb_Message *msg2_local;
  upb_Message *msg1_local;
  
  if (msg1 == msg2) {
    msg1_local._7_1_ = true;
  }
  else {
    _Var1 = _upb_Message_BaseFieldsAreEqual(msg1,msg2,m,options);
    if (_Var1) {
      _Var1 = _upb_Message_ExtensionsAreEqual(msg1,msg2,m,options);
      if (_Var1) {
        if ((options & 1U) == 0) {
          msg1_local._7_1_ = true;
        }
        else {
          uVar2 = _upb_Message_UnknownFieldsAreEqual_dont_copy_me__upb_internal_use_only
                            (msg1,msg2,100);
          msg1_local._7_1_ = uVar2 == kUpb_UnknownCompareResult_Equal;
        }
      }
      else {
        msg1_local._7_1_ = false;
      }
    }
    else {
      msg1_local._7_1_ = false;
    }
  }
  return msg1_local._7_1_;
}

Assistant:

bool upb_Message_IsEqual(const upb_Message* msg1, const upb_Message* msg2,
                         const upb_MiniTable* m, int options) {
  if (UPB_UNLIKELY(msg1 == msg2)) return true;

  if (!_upb_Message_BaseFieldsAreEqual(msg1, msg2, m, options)) return false;
  if (!_upb_Message_ExtensionsAreEqual(msg1, msg2, m, options)) return false;

  if (!(options & kUpb_CompareOption_IncludeUnknownFields)) return true;

  // The wire encoder enforces a maximum depth of 100 so we match that here.
  return UPB_PRIVATE(_upb_Message_UnknownFieldsAreEqual)(msg1, msg2, 100) ==
         kUpb_UnknownCompareResult_Equal;
}